

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
     *this)

{
  uint uVar1;
  Fad<Fad<double>_> *pFVar2;
  double *pdVar3;
  int lsz;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  value_type local_40;
  
  FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
  ::val(&local_40,&this->left_->fadexpr_);
  pFVar2 = this->right_;
  __return_storage_ptr__->val_ = local_40.val_ * (pFVar2->val_).val_;
  uVar1 = (pFVar2->val_).dx_.num_elts;
  if ((int)uVar1 < local_40.dx_.num_elts) {
    uVar1 = local_40.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar1) {
    (__return_storage_ptr__->dx_).num_elts = uVar1;
    pdVar3 = (double *)operator_new__((ulong)uVar1 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar3;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  uVar1 = (pFVar2->val_).dx_.num_elts;
  uVar4 = uVar1;
  if ((int)uVar1 < local_40.dx_.num_elts) {
    uVar4 = local_40.dx_.num_elts;
  }
  if (0 < (int)uVar4) {
    pdVar3 = (__return_storage_ptr__->dx_).ptr_to_data;
    uVar5 = (ulong)uVar4;
    lVar6 = 0;
    do {
      pdVar7 = (double *)((long)local_40.dx_.ptr_to_data + lVar6);
      if (local_40.dx_.num_elts == 0) {
        pdVar7 = &local_40.defaultVal;
      }
      pdVar8 = (double *)((long)(pFVar2->val_).dx_.ptr_to_data + lVar6);
      if (uVar1 == 0) {
        pdVar8 = &(pFVar2->val_).defaultVal;
      }
      *(double *)((long)pdVar3 + lVar6) = *pdVar7 * (pFVar2->val_).val_ + *pdVar8 * local_40.val_;
      lVar6 = lVar6 + 8;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  Fad<double>::~Fad(&local_40);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}